

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O1

SUNErrCode
N_VWrmsNormMaskVectorArray_Serial(int nvec,N_Vector *X,N_Vector *W,N_Vector id,sunrealtype *nrm)

{
  N_Vector x;
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  sunrealtype sVar7;
  double dVar8;
  double dVar9;
  
  x = *X;
  if (nvec == 1) {
    sVar7 = N_VWSqrSumMaskLocal_Serial(x,*W,id);
    dVar8 = sVar7 / (double)*x->content;
    dVar9 = 0.0;
    if (0.0 < dVar8) {
      if (dVar8 < 0.0) {
        dVar9 = sqrt(dVar8);
      }
      else {
        dVar9 = SQRT(dVar8);
      }
    }
    *nrm = dVar9;
  }
  else if (0 < nvec) {
    lVar1 = *x->content;
    lVar2 = *(long *)((long)id->content + 0x10);
    uVar6 = 0;
    do {
      lVar3 = *(long *)((long)X[uVar6]->content + 0x10);
      lVar4 = *(long *)((long)W[uVar6]->content + 0x10);
      nrm[uVar6] = 0.0;
      if (0 < lVar1) {
        lVar5 = 0;
        do {
          if (0.0 < *(double *)(lVar2 + lVar5 * 8)) {
            dVar8 = *(double *)(lVar3 + lVar5 * 8) * *(double *)(lVar4 + lVar5 * 8);
            nrm[uVar6] = dVar8 * dVar8 + nrm[uVar6];
          }
          lVar5 = lVar5 + 1;
        } while (lVar1 != lVar5);
      }
      dVar8 = nrm[uVar6] / (double)lVar1;
      dVar9 = 0.0;
      if (0.0 < dVar8) {
        if (dVar8 < 0.0) {
          dVar9 = sqrt(dVar8);
        }
        else {
          dVar9 = SQRT(dVar8);
        }
      }
      nrm[uVar6] = dVar9;
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)nvec);
  }
  return 0;
}

Assistant:

SUNErrCode N_VWrmsNormMaskVectorArray_Serial(int nvec, N_Vector* X, N_Vector* W,
                                             N_Vector id, sunrealtype* nrm)
{
  SUNFunctionBegin(X[0]->sunctx);
  int i;
  sunindextype j, N;
  sunrealtype* wd  = NULL;
  sunrealtype* xd  = NULL;
  sunrealtype* idd = NULL;

  /* invalid number of vectors */
  SUNAssert(nvec >= 1, SUN_ERR_ARG_OUTOFRANGE);

  /* should have called N_VWrmsNorm */
  if (nvec == 1)
  {
    nrm[0] = N_VWrmsNormMask_Serial(X[0], W[0], id);
    SUNCheckLastErr();
    return SUN_SUCCESS;
  }

  /* get vector length and mask data array */
  N   = NV_LENGTH_S(X[0]);
  idd = NV_DATA_S(id);

  /* compute the WRMS norm for each vector in the vector array */
  for (i = 0; i < nvec; i++)
  {
    xd     = NV_DATA_S(X[i]);
    wd     = NV_DATA_S(W[i]);
    nrm[i] = ZERO;
    for (j = 0; j < N; j++)
    {
      if (idd[j] > ZERO) { nrm[i] += SUNSQR(xd[j] * wd[j]); }
    }
    nrm[i] = SUNRsqrt(nrm[i] / N);
  }

  return SUN_SUCCESS;
}